

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * targetSrcList(Parse *pParse,TriggerStep *pStep)

{
  sqlite3 *db_00;
  int iVar1;
  SrcList *pSVar2;
  char *pcVar3;
  char *zDb;
  SrcList *pSrc;
  int iDb;
  sqlite3 *db;
  TriggerStep *pStep_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pSVar2 = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSVar2 != (SrcList *)0x0) {
    pcVar3 = sqlite3DbStrDup(db_00,pStep->zTarget);
    pSVar2->a[pSVar2->nSrc + -1].zName = pcVar3;
    iVar1 = sqlite3SchemaToIndex(db_00,pStep->pTrig->pSchema);
    if ((iVar1 == 0) || (1 < iVar1)) {
      pcVar3 = sqlite3DbStrDup(db_00,db_00->aDb[iVar1].zDbSName);
      pSVar2->a[pSVar2->nSrc + -1].zDatabase = pcVar3;
    }
  }
  return pSVar2;
}

Assistant:

static SrcList *targetSrcList(
  Parse *pParse,       /* The parsing context */
  TriggerStep *pStep   /* The trigger containing the target token */
){
  sqlite3 *db = pParse->db;
  int iDb;             /* Index of the database to use */
  SrcList *pSrc;       /* SrcList to be returned */

  pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
  if( pSrc ){
    assert( pSrc->nSrc>0 );
    pSrc->a[pSrc->nSrc-1].zName = sqlite3DbStrDup(db, pStep->zTarget);
    iDb = sqlite3SchemaToIndex(db, pStep->pTrig->pSchema);
    if( iDb==0 || iDb>=2 ){
      const char *zDb;
      assert( iDb<db->nDb );
      zDb = db->aDb[iDb].zDbSName;
      pSrc->a[pSrc->nSrc-1].zDatabase =  sqlite3DbStrDup(db, zDb);
    }
  }
  return pSrc;
}